

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_nil(FuncState *fs,int from,int n)

{
  Instruction *pIVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  lVar3 = (long)fs->pc;
  if (fs->lasttarget < fs->pc) {
    pIVar1 = fs->f->code;
    uVar5 = pIVar1[lVar3 + -1];
    if ((char)uVar5 == '\x04') {
      uVar2 = uVar5 >> 8 & 0x7f;
      if ((from <= (int)(uVar2 + 1 + (uVar5 >> 0x18)) && (int)uVar2 <= from) ||
         ((int)uVar2 <= n + from && from <= (int)uVar2)) {
        iVar4 = (uVar5 >> 0x18) + uVar2;
        uVar5 = from;
        if ((int)uVar2 < from) {
          uVar5 = uVar2;
        }
        if (iVar4 < n + from) {
          iVar4 = n + -1 + from;
        }
        *(byte *)((long)pIVar1 + lVar3 * 4 + -3) = (byte)uVar5 & 0x7f;
        if (((byte)ravi_parser_debug & 2) != 0) {
          raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(fs->pc - 1),(ulong)pIVar1[lVar3 + -1],
                       (ulong)uVar5);
        }
        *(char *)((long)pIVar1 + lVar3 * 4 + -1) = (char)(iVar4 - uVar5);
        if (((byte)ravi_parser_debug & 2) == 0) {
          return;
        }
        raviY_printf(fs,"[%d]* %o ; set B to %d\n",(ulong)(fs->pc - 1),(ulong)pIVar1[lVar3 + -1],
                     (ulong)(iVar4 - uVar5));
        return;
      }
    }
  }
  luaK_codeABC(fs,OP_LOADNIL,from,n + -1,0);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  Instruction *previous;
  int l = from + n - 1;  /* last register to set nil */
  if (fs->pc > fs->lasttarget) {  /* no jumps to current position? */
    previous = &fs->f->code[fs->pc-1];
    if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
      int pfrom = GETARG_A(*previous);  /* get previous range */
      int pl = pfrom + GETARG_B(*previous);
      if ((pfrom <= from && from <= pl + 1) ||
          (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
        if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
        if (pl > l) l = pl;  /* l = max(l, pl) */
        SETARG_A(*previous, from);
        DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", fs->pc - 1, *previous, from));
        SETARG_B(*previous, l - from);
        DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set B to %d\n", fs->pc - 1, *previous, (l - from)));
        return;
      }
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}